

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.cpp
# Opt level: O1

void __thiscall AGSMock::Unimplemented::Unimplemented(Unimplemented *this,char *name)

{
  long *plVar1;
  long *plVar2;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Unimplemented AGSMock function called: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  *(undefined ***)this = &PTR__logic_error_00110608;
  return;
}

Assistant:

Unimplemented::Unimplemented(const char *name)
	: logic_error(string("Unimplemented AGSMock function called: ") + name) {}